

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.h
# Opt level: O0

void google::protobuf::compiler::java::
     MaybePrintGeneratedAnnotation<google::protobuf::Descriptor_const>
               (Context *context,Printer *printer,Descriptor *descriptor,bool immutable,
               string *suffix)

{
  Descriptor *printer_00;
  bool bVar1;
  Options *pOVar2;
  string local_50;
  string *local_30;
  string *suffix_local;
  Descriptor *pDStack_20;
  bool immutable_local;
  Descriptor *descriptor_local;
  Printer *printer_local;
  Context *context_local;
  
  local_30 = suffix;
  suffix_local._7_1_ = immutable;
  pDStack_20 = descriptor;
  descriptor_local = (Descriptor *)printer;
  printer_local = (Printer *)context;
  pOVar2 = Context::options(context);
  if (((pOVar2->annotate_code & 1U) != 0) &&
     (bVar1 = IsOwnFile<google::protobuf::Descriptor>(pDStack_20,(bool)(suffix_local._7_1_ & 1)),
     printer_00 = descriptor_local, bVar1)) {
    AnnotationFileName<google::protobuf::Descriptor>(&local_50,pDStack_20,local_30);
    PrintGeneratedAnnotation((Printer *)printer_00,'$',&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return;
}

Assistant:

void MaybePrintGeneratedAnnotation(Context* context, io::Printer* printer,
                                   Descriptor* descriptor, bool immutable,
                                   const string& suffix = "") {
  if (context->options().annotate_code && IsOwnFile(descriptor, immutable)) {
    PrintGeneratedAnnotation(printer, '$',
                             AnnotationFileName(descriptor, suffix));
  }
}